

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new_meshfile_operations.cpp
# Opt level: O0

line_type MSH::hash_line_type(string *inString)

{
  bool bVar1;
  string *inString_local;
  
  bVar1 = std::operator==(inString,"$MeshFormat");
  if (bVar1) {
    inString_local._4_4_ = eMeshFormat;
  }
  else {
    bVar1 = std::operator==(inString,"$PhysicalNames");
    if (bVar1) {
      inString_local._4_4_ = ePhysicalNames;
    }
    else {
      bVar1 = std::operator==(inString,"$Nodes");
      if (bVar1) {
        inString_local._4_4_ = eNodes;
      }
      else {
        bVar1 = std::operator==(inString,"$Elements");
        if (bVar1) {
          inString_local._4_4_ = eElements;
        }
        else {
          inString_local._4_4_ = eDefault;
        }
      }
    }
  }
  return inString_local._4_4_;
}

Assistant:

MSH::line_type MSH::hash_line_type(std::string const& inString)
{
    if(inString == "$MeshFormat") return eMeshFormat;
    if(inString == "$PhysicalNames") return ePhysicalNames;
    if(inString == "$Nodes") return eNodes;
    if(inString == "$Elements") return eElements;
    return eDefault;
}